

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argagg.hpp
# Opt level: O1

unsigned_short argagg::convert::long_<unsigned_short>(char *arg)

{
  int *piVar1;
  long lVar2;
  ostream *poVar3;
  invalid_argument *this;
  out_of_range *this_00;
  char *endptr;
  ostringstream msg;
  char *local_1c0;
  string local_1b8 [32];
  ostream local_198;
  
  local_1c0 = (char *)0x0;
  piVar1 = __errno_location();
  *piVar1 = 0;
  lVar2 = strtol(arg,&local_1c0,0);
  if (local_1c0 == arg) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_198);
    std::__ostream_insert<char,std::char_traits<char>>
              (&local_198,"unable to convert argument to integer: \"",0x28);
    poVar3 = std::operator<<(&local_198,arg);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\"",1);
    this = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::invalid_argument::invalid_argument(this,local_1b8);
    __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  if (*piVar1 != 0x22) {
    return (unsigned_short)lVar2;
  }
  this_00 = (out_of_range *)__cxa_allocate_exception(0x10);
  std::out_of_range::out_of_range(this_00,"argument numeric value out of range");
  __cxa_throw(this_00,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
}

Assistant:

inline
  T long_(const char* arg)
  {
    char* endptr = nullptr;
    errno = 0;
    T ret = static_cast<T>(std::strtol(arg, &endptr, 0));
    if (endptr == arg) {
      std::ostringstream msg;
      msg << "unable to convert argument to integer: \"" << arg << "\"";
      throw std::invalid_argument(msg.str());
    }
    if (errno == ERANGE) {
      throw std::out_of_range("argument numeric value out of range");
    }
    return ret;
  }